

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O1

void __thiscall
gimage::PNGImageIO::load
          (PNGImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  uchar *puVar1;
  int *piVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  FILE *__stream;
  __jmp_buf_tag *__env;
  void *pvVar12;
  size_type *psVar13;
  IOException *pIVar14;
  long *plVar15;
  uint uVar16;
  void *pvVar17;
  long lVar18;
  ulong uVar19;
  size_t __n;
  ulong uVar20;
  void *pvVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ImageU8 *pIVar26;
  png_infop info;
  png_infop end;
  long local_190;
  allocator local_185;
  int local_184;
  long local_180;
  ulong local_178;
  string local_170;
  long local_150;
  ulong local_148;
  long local_140;
  long local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  long local_118;
  uint local_10c;
  int local_108;
  uint local_104;
  ulong local_100;
  long local_f8;
  ulong local_f0;
  ulong local_e8;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  ImageU8 *local_b8;
  FILE *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long local_68;
  void *local_60;
  long local_58;
  void *local_50;
  long local_48;
  ulong local_40;
  char *local_38;
  
  local_184 = ds;
  local_140 = x;
  local_138 = y;
  iVar9 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar9 == '\0') {
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_a8,name,(allocator *)&local_190);
    std::operator+(&local_88,"Can only load PNG image (",&local_a8);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_170._M_dataplus._M_p = (pointer)*plVar15;
    psVar13 = (size_type *)(plVar15 + 2);
    if ((size_type *)local_170._M_dataplus._M_p == psVar13) {
      local_170.field_2._M_allocated_capacity = *psVar13;
      local_170.field_2._8_8_ = plVar15[3];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar13;
    }
    local_170._M_string_length = plVar15[1];
    *plVar15 = (long)psVar13;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    gutil::IOException::IOException(pIVar14,&local_170);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_b8 = image;
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_a8,name,(allocator *)&local_190);
    std::operator+(&local_88,"Cannot open file (",&local_a8);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_170._M_dataplus._M_p = (pointer)*plVar15;
    psVar13 = (size_type *)(plVar15 + 2);
    if ((size_type *)local_170._M_dataplus._M_p == psVar13) {
      local_170.field_2._M_allocated_capacity = *psVar13;
      local_170.field_2._8_8_ = plVar15[3];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar13;
    }
    local_170._M_string_length = plVar15[1];
    *plVar15 = (long)psVar13;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    gutil::IOException::IOException(pIVar14,&local_170);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_190 = png_create_read_struct("1.6.37",0,0);
  if (local_190 == 0) {
    fclose(__stream);
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"Cannot allocate handle for reading PNG files","");
    gutil::IOException::IOException(pIVar14,&local_170);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_180 = png_create_info_struct(local_190);
  if (local_180 == 0) {
    png_destroy_read_struct(&local_190,0);
    fclose(__stream);
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar14,&local_170);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_118 = png_create_info_struct(local_190);
  if (local_118 == 0) {
    png_destroy_read_struct(&local_190,&local_180,0);
    fclose(__stream);
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar14,&local_170);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_190,longjmp,200);
  iVar9 = _setjmp(__env);
  if (iVar9 != 0) {
    png_destroy_read_struct(&local_190,&local_180,&local_118);
    fclose(__stream);
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_a8,name,&local_185);
    std::operator+(&local_88,"Cannot read PNG file (",&local_a8);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_170._M_dataplus._M_p = (pointer)*plVar15;
    psVar13 = (size_type *)(plVar15 + 2);
    if ((size_type *)local_170._M_dataplus._M_p == psVar13) {
      local_170.field_2._M_allocated_capacity = *psVar13;
      local_170.field_2._8_8_ = plVar15[3];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar13;
    }
    local_170._M_string_length = plVar15[1];
    *plVar15 = (long)psVar13;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    gutil::IOException::IOException(pIVar14,&local_170);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_b0 = __stream;
  png_init_io(local_190,__stream);
  png_read_info(local_190,local_180);
  uVar10 = png_get_image_width(local_190,local_180);
  uVar11 = png_get_image_height(local_190,local_180);
  bVar7 = png_get_color_type(local_190,local_180);
  pIVar26 = local_b8;
  uVar16 = 1;
  if ((byte)(bVar7 - 2) < 5) {
    uVar16 = *(uint *)(&DAT_001512c0 + (ulong)(byte)(bVar7 - 2) * 4);
  }
  uVar19 = (ulong)uVar11;
  if (w < 0) {
    w = (long)((ulong)uVar10 + (long)local_184 + -1) / (long)local_184;
  }
  if (h < 0) {
    h = (long)((long)local_184 + uVar19 + -1) / (long)local_184;
  }
  local_e8 = (ulong)uVar16;
  local_178 = (ulong)uVar10;
  local_128 = h;
  local_104 = uVar16;
  local_38 = name;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(local_b8,w,h,local_e8);
  sVar4 = pIVar26->n;
  __n = -sVar4;
  if (0 < (long)sVar4) {
    __n = sVar4;
  }
  memset(pIVar26->pixel,0,__n);
  if (bVar7 == 3) {
    png_set_palette_to_rgb(local_190);
  }
  bVar8 = png_get_bit_depth(local_190,local_180);
  if (8 < bVar8) {
    png_destroy_read_struct(&local_190,&local_180,&local_118);
    fclose(local_b0);
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_a8,local_38,&local_185);
    std::operator+(&local_88,"PNG with <= 8 bits expected (",&local_a8);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_170._M_dataplus._M_p = (pointer)*plVar15;
    psVar13 = (size_type *)(plVar15 + 2);
    if ((size_type *)local_170._M_dataplus._M_p == psVar13) {
      local_170.field_2._M_allocated_capacity = *psVar13;
      local_170.field_2._8_8_ = plVar15[3];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar13;
    }
    local_170._M_string_length = plVar15[1];
    *plVar15 = (long)psVar13;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    gutil::IOException::IOException(pIVar14,&local_170);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  if (bVar8 != 8 && bVar7 == 0) {
    png_set_expand_gray_1_2_4_to_8(local_190);
  }
  if ((bVar7 & 4) != 0) {
    png_set_strip_alpha(local_190);
  }
  png_read_update_info(local_190,local_180);
  iVar9 = png_get_rowbytes(local_190,local_180);
  uVar20 = 0xffffffffffffffff;
  if (-1 < (long)((long)iVar9 * uVar19)) {
    uVar20 = (long)iVar9 * uVar19;
  }
  local_c0 = operator_new__(uVar20);
  pvVar12 = operator_new__(uVar19 * 8);
  if (uVar19 != 0) {
    uVar20 = 0;
    pvVar17 = local_c0;
    do {
      *(void **)((long)pvVar12 + uVar20 * 8) = pvVar17;
      uVar20 = uVar20 + 1;
      pvVar17 = (void *)((long)pvVar17 + (long)iVar9);
    } while (uVar19 != uVar20);
  }
  png_read_image(local_190);
  if ((((local_184 < 2) && (local_138 == 0 && local_140 == 0)) && (w == local_178)) &&
     (local_128 == uVar19)) {
    if (uVar19 != 0) {
      uVar20 = 0;
      do {
        if ((int)local_178 != 0) {
          uVar24 = 0;
          uVar23 = uVar24;
          do {
            uVar23 = (ulong)(int)uVar23;
            uVar25 = 0;
            do {
              puVar1 = (uchar *)(*(long *)((long)pvVar12 + uVar20 * 8) + uVar23);
              uVar23 = uVar23 + 1;
              pIVar26->img[uVar25][uVar20][uVar24] = *puVar1;
              uVar25 = uVar25 + 1;
            } while (uVar16 != uVar25);
            uVar24 = uVar24 + 1;
          } while (uVar24 != local_178);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar19);
    }
  }
  else {
    uVar20 = w * local_e8 * 4;
    local_10c = uVar16;
    pvVar17 = operator_new(uVar20);
    local_d0 = pvVar17;
    if (w != 0) {
      memset(pvVar17,0,uVar20);
    }
    local_e0 = operator_new(uVar20);
    local_148 = w;
    local_120 = uVar19;
    local_d8 = local_e0;
    local_c8 = pvVar12;
    if (w != 0) {
      memset(local_e0,0,uVar20);
    }
    uVar19 = 0;
    if (-local_138 != 0 && local_138 < 1) {
      uVar19 = -local_138;
    }
    if ((long)uVar19 < (long)local_128) {
      local_150 = (long)local_184;
      uVar23 = local_150 * local_138;
      if (local_150 * local_138 < 1) {
        uVar23 = 0;
      }
      local_108 = 0;
      if (0 < local_140) {
        local_108 = (int)local_140;
      }
      local_108 = local_108 * local_104 * local_184;
      local_130 = -local_140;
      if (-local_140 == 0 || 0 < local_140) {
        local_130 = 0;
      }
      local_48 = local_130 * local_e8;
      uVar24 = (ulong)local_10c;
      local_50 = (void *)((long)local_d8 + local_130 * uVar24 * 4);
      local_58 = uVar24 * 4;
      local_60 = (void *)((long)local_d0 + local_130 * uVar24 * 4);
      local_40 = local_130;
      do {
        local_f8 = (local_138 + uVar19) * local_150;
        local_f0 = uVar19;
        if ((long)local_120 <= local_f8) break;
        if (local_148 != 0) {
          memset(pvVar17,0,uVar20);
          memset(local_e0,0,uVar20);
        }
        if ((0 < local_184) && (local_f8 < (long)local_120)) {
          uVar23 = (long)(int)uVar23;
          lVar22 = 0;
          do {
            local_68 = lVar22;
            local_100 = uVar23;
            pvVar12 = local_60;
            pvVar21 = local_50;
            uVar19 = local_130;
            iVar9 = local_108;
            if ((long)local_130 < (long)local_148) {
              do {
                lVar22 = (uVar19 + local_140) * local_150;
                if ((long)local_178 <= lVar22) break;
                if (0 < local_184) {
                  lVar5 = *(long *)((long)local_c8 + local_100 * 8);
                  lVar18 = 0;
                  do {
                    iVar6 = iVar9;
                    uVar23 = 0;
                    do {
                      piVar2 = (int *)((long)pvVar12 + uVar23 * 4);
                      *piVar2 = *piVar2 + (uint)*(byte *)(iVar6 + lVar5 + uVar23);
                      piVar2 = (int *)((long)pvVar21 + uVar23 * 4);
                      *piVar2 = *piVar2 + 1;
                      uVar23 = uVar23 + 1;
                    } while (uVar24 != uVar23);
                  } while ((lVar18 + 1 < local_150) &&
                          (lVar3 = lVar22 + lVar18, lVar18 = lVar18 + 1, iVar9 = (int)uVar23 + iVar6
                          , lVar3 + 1 < (long)local_178));
                  iVar9 = iVar6 + (int)uVar23;
                  pIVar26 = local_b8;
                }
                uVar19 = uVar19 + 1;
                pvVar12 = (void *)((long)pvVar12 + local_58);
                pvVar21 = (void *)((long)pvVar21 + local_58);
              } while (uVar19 != local_148);
            }
            uVar23 = local_100 + 1;
          } while ((local_68 + 1 < local_150) &&
                  (lVar22 = local_68 + 1, local_68 + local_f8 + 1 < (long)local_120));
        }
        uVar23 = uVar23 & 0xffffffff;
        lVar22 = local_48;
        uVar19 = local_40;
        if ((long)local_130 < (long)local_148) {
          do {
            if ((long)local_178 <= (long)((local_140 + uVar19) * local_150)) break;
            uVar25 = 0;
            do {
              uVar16 = *(uint *)((long)local_d8 + uVar25 * 4 + lVar22 * 4);
              if (0 < (int)uVar16) {
                pIVar26->img[uVar25][local_f0][uVar19] =
                     (uchar)((int)((uVar16 >> 1) +
                                  *(int *)((long)local_d0 + uVar25 * 4 + lVar22 * 4)) / (int)uVar16)
                ;
              }
              uVar25 = uVar25 + 1;
            } while (uVar24 != uVar25);
            uVar19 = uVar19 + 1;
            lVar22 = lVar22 + uVar25;
          } while (uVar19 != local_148);
        }
        uVar19 = local_f0 + 1;
      } while (uVar19 != local_128);
    }
    operator_delete(local_e0);
    operator_delete(pvVar17);
    pvVar12 = local_c8;
  }
  operator_delete__(pvVar12);
  operator_delete__(local_c0);
  png_destroy_read_struct(&local_190,&local_180,&local_118);
  fclose(local_b0);
  return;
}

Assistant:

void PNGImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // adapt size of image

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  // make sure that there are 8 Bits per color channel

  int bits=png_get_bit_depth(png, info);

  if (bits > 8)
  {
    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("PNG with <= 8 bits expected ("+std::string(name)+")");
  }

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // strip alpha channel if available

  if ((color & PNG_COLOR_MASK_ALPHA) != 0)
  {
    png_set_strip_alpha(png);
  }

  png_read_update_info(png, info);

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU8::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    int rk=std::max(0l, y*ds);

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU8::store_t v=static_cast<ImageU8::store_t>(row[rk][jj++]);

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }

        rk++;
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>((vline[j]+nline[j]/2)/nline[j]));
          }

          j++;
        }
      }
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          image.set(i, k, d, static_cast<ImageU8::store_t>(row[k][j++]));
        }
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}